

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void SetTexture(sector_t_conflict *sector,int index,int position,char *name,
               FMissingTextureTracker *track,bool truncate)

{
  int iVar1;
  FTextureID tex;
  FMissingCount *pFVar2;
  undefined3 in_register_00000089;
  char *__dest;
  FString FStack_48;
  char name8 [9];
  
  __dest = name;
  if (CONCAT31(in_register_00000089,truncate) != 0) {
    __dest = name8;
    strncpy(__dest,name,8);
    name8[8] = '\0';
  }
  tex = FTextureManager::CheckForTexture(&TexMan,__dest,2,3);
  if (tex.texnum < 0) {
    FString::FString(&FStack_48,__dest);
    pFVar2 = TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::
             operator[](track,&FStack_48);
    iVar1 = pFVar2->Count;
    pFVar2->Count = iVar1 + 1;
    FString::~FString(&FStack_48);
    tex = TexMan.DefaultTexture;
    if (iVar1 < 0x14) {
      Printf("\x1cGUnknown %s texture \'\x1cI%s\x1cG\' in sector %d\n",
             (long)&
                   _ZZ10SetTextureP8sector_tiiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEbE13positionnames_rel
             + (long)*(int *)((long)&
                                    _ZZ10SetTextureP8sector_tiiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEbE13positionnames_rel
                             + (long)position * 4),__dest,index);
      tex = TexMan.DefaultTexture;
    }
  }
  sector_t::SetTexture((sector_t *)sector,position,tex,true);
  return;
}

Assistant:

void SetTexture (sector_t *sector, int index, int position, const char *name, FMissingTextureTracker &track, bool truncate)
{
	static const char *positionnames[] = { "floor", "ceiling" };
	char name8[9];
	if (truncate)
	{
		strncpy(name8, name, 8);
		name8[8] = 0;
		name = name8;
	}

	FTextureID texture = TexMan.CheckForTexture (name, FTexture::TEX_Flat,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);

	if (!texture.Exists())
	{
		if (++track[name].Count <= MISSING_TEXTURE_WARN_LIMIT)
		{
			Printf(TEXTCOLOR_RED"Unknown %s texture '"
				TEXTCOLOR_ORANGE "%s" TEXTCOLOR_RED
				"' in sector %d\n",
				positionnames[position], name, index);
		}
		texture = TexMan.GetDefaultTexture();
	}
	sector->SetTexture(position, texture);
}